

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  bool bVar1;
  CURLcode CVar2;
  time_t tVar3;
  byte local_4c;
  _Bool local_4a;
  byte local_49;
  int local_48;
  _Bool getadded;
  CURLcode CStack_44;
  _Bool sleeping;
  CURLMcode mcode;
  CURLcode result;
  per_transfer *per;
  _Bool *addedp_local;
  _Bool *morep_local;
  CURLSH *share_local;
  CURLM *multi_local;
  GlobalConfig *global_local;
  
  CStack_44 = 0;
  local_49 = 0;
  *addedp = false;
  *morep = false;
  per = (per_transfer *)addedp;
  addedp_local = morep;
  morep_local = (_Bool *)share;
  share_local = (CURLSH *)multi;
  multi_local = (CURLM *)global;
  global_local._4_4_ = create_transfer(global,share,addedp);
  if (global_local._4_4_ == CURLE_OK) {
    _mcode = transfers;
    CStack_44 = 0;
    while( true ) {
      bVar1 = false;
      if (_mcode != (per_transfer *)0x0) {
        bVar1 = all_added < *(long *)(multi_local + 0x48);
      }
      if (!bVar1) break;
      local_4a = false;
      if ((_mcode->added & 1U) == 0) {
        if ((_mcode->startat == 0) || (tVar3 = time((time_t *)0x0), _mcode->startat <= tVar3)) {
          CStack_44 = pre_transfer((GlobalConfig *)multi_local,_mcode);
          if (CStack_44 != CURLE_OK) {
            return CStack_44;
          }
          curl_easy_setopt(_mcode->curl,0xed,((byte)multi_local[0x50] & 1) == 0);
          curl_easy_setopt(_mcode->curl,0x2777,_mcode);
          curl_easy_setopt(_mcode->curl,0x4efb,xferinfo_cb);
          curl_easy_setopt(_mcode->curl,0x2749,_mcode);
          local_48 = curl_multi_add_handle(share_local,_mcode->curl);
          if (local_48 != 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar2 = create_transfer((GlobalConfig *)multi_local,(CURLSH *)morep_local,&local_4a);
          if (CVar2 != CURLE_OK) {
            return CVar2;
          }
          _mcode->added = true;
          all_added = all_added + 1;
          *(undefined1 *)&per->next = 1;
          CStack_44 = 0;
        }
        else {
          local_49 = 1;
        }
      }
      _mcode = _mcode->next;
    }
    local_4c = 1;
    if (_mcode == (per_transfer *)0x0) {
      local_4c = local_49;
    }
    *addedp_local = (local_4c & 1) != 0;
    global_local._4_4_ = CURLE_OK;
  }
  return global_local._4_4_;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  *addedp = FALSE;
  *morep = FALSE;
  result = create_transfer(global, share, addedp);
  if(result)
    return result;
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }

    result = pre_transfer(global, per);
    if(result)
      return result;

    /* parallel connect means that we don't set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode)
      return CURLE_OUT_OF_MEMORY;

    result = create_transfer(global, share, &getadded);
    if(result)
      return result;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}